

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cc
# Opt level: O0

void brotli::CreateBackwardReferences<brotli::HashLongestMatch<15,7,10>>
               (size_t num_bytes,size_t position,bool is_last,uint8_t *ringbuffer,
               size_t ringbuffer_mask,int quality,int lgwin,HashLongestMatch<15,_7,_10> *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  int iVar1;
  ulong uVar2;
  double *pdVar3;
  unsigned_long *puVar4;
  unsigned_long local_178;
  unsigned_long local_170;
  unsigned_long local_168;
  ulong local_160;
  size_t i_jump_1;
  unsigned_long local_150;
  ulong local_148;
  size_t i_jump;
  size_t j;
  Command cmd;
  size_t distance_code;
  undefined8 local_110;
  double cost_diff_lazy;
  double local_100;
  double best_score_2;
  size_t best_dist_2;
  size_t best_len_code_2;
  unsigned_long local_e0;
  size_t best_len_2;
  int delayed_backward_references_in_row;
  bool match_found;
  double best_score;
  size_t best_dist;
  size_t best_len_code;
  size_t best_len;
  double local_a8;
  size_t max_distance;
  size_t max_length;
  ulong uStack_90;
  int kMinScore;
  size_t apply_random_heuristics;
  size_t random_heuristics_window_size;
  size_t i_end;
  size_t i_diff;
  size_t i;
  size_t insert_length;
  Command *orig_commands;
  size_t kMaxBytesForPartialHashInit;
  size_t max_backward_limit;
  size_t sStack_40;
  int quality_local;
  size_t ringbuffer_mask_local;
  uint8_t *ringbuffer_local;
  size_t sStack_28;
  bool is_last_local;
  size_t position_local;
  size_t num_bytes_local;
  
  kMaxBytesForPartialHashInit = (size_t)((1 << ((byte)lgwin & 0x1f)) + -0x10);
  orig_commands = (Command *)0x200;
  max_backward_limit._4_4_ = quality;
  sStack_40 = ringbuffer_mask;
  ringbuffer_mask_local = (size_t)ringbuffer;
  ringbuffer_local._7_1_ = is_last;
  sStack_28 = position;
  position_local = num_bytes;
  if (((position == 0) && (is_last)) && (num_bytes < 0x201)) {
    HashLongestMatch<15,_7,_10>::InitForData(hasher,ringbuffer,num_bytes);
  }
  else {
    HashLongestMatch<15,_7,_10>::Init(hasher);
  }
  if ((2 < position_local) && (2 < sStack_28)) {
    HashLongestMatch<15,_7,_10>::Store
              (hasher,(uint8_t *)(ringbuffer_mask_local + (sStack_28 - 3 & sStack_40)),
               (int)sStack_28 - 3);
    HashLongestMatch<15,_7,_10>::Store
              (hasher,(uint8_t *)(ringbuffer_mask_local + (sStack_28 - 2 & sStack_40)),
               (int)sStack_28 - 2);
    HashLongestMatch<15,_7,_10>::Store
              (hasher,(uint8_t *)(ringbuffer_mask_local + (sStack_28 - 1 & sStack_40)),
               (int)sStack_28 - 1);
  }
  insert_length = (size_t)commands;
  i = *last_insert_len;
  uVar2 = sStack_28 & sStack_40;
  i_end = sStack_28 - uVar2;
  random_heuristics_window_size = uVar2 + position_local;
  iVar1 = 0x200;
  if (max_backward_limit._4_4_ < 9) {
    iVar1 = 0x40;
  }
  apply_random_heuristics = (size_t)iVar1;
  uStack_90 = uVar2 + apply_random_heuristics;
  max_length._4_4_ = 4;
  do {
    while( true ) {
      i_diff = uVar2;
      if (random_heuristics_window_size <= i_diff + 3) {
        *last_insert_len = (random_heuristics_window_size - i_diff) + i;
        *num_commands = (long)((long)commands - insert_length) / 0x18 + *num_commands;
        return;
      }
      max_distance = random_heuristics_window_size - i_diff;
      best_len = i_diff + i_end;
      pdVar3 = (double *)std::min<unsigned_long>(&best_len,&kMaxBytesForPartialHashInit);
      local_a8 = *pdVar3;
      best_len_code = 0;
      best_dist = 0;
      best_score = 0.0;
      _delayed_backward_references_in_row = 4.0;
      best_len_2._7_1_ =
           HashLongestMatch<15,_7,_10>::FindLongestMatch
                     (hasher,(uint8_t *)ringbuffer_mask_local,sStack_40,dist_cache,
                      (ulong)(uint)((int)i_diff + (int)i_end),max_distance,(size_t)local_a8,
                      &best_len_code,&best_dist,(size_t *)&best_score,
                      (double *)&delayed_backward_references_in_row);
      if ((bool)best_len_2._7_1_) break;
      i = i + 1;
      uVar2 = i_diff + 1;
      if (uStack_90 < uVar2) {
        if (uStack_90 + apply_random_heuristics * 4 < uVar2) {
          local_150 = i_diff + 0x11;
          i_jump_1 = random_heuristics_window_size - 4;
          i_diff = uVar2;
          puVar4 = std::min<unsigned_long>(&local_150,&i_jump_1);
          local_148 = *puVar4;
          for (; uVar2 = i_diff, i_diff < local_148; i_diff = i_diff + 4) {
            HashLongestMatch<15,_7,_10>::Store
                      (hasher,(uint8_t *)(ringbuffer_mask_local + i_diff),(int)i_diff + (int)i_end);
            i = i + 4;
          }
        }
        else {
          local_168 = i_diff + 9;
          local_170 = random_heuristics_window_size - 3;
          i_diff = uVar2;
          puVar4 = std::min<unsigned_long>(&local_168,&local_170);
          local_160 = *puVar4;
          for (; uVar2 = i_diff, i_diff < local_160; i_diff = i_diff + 2) {
            HashLongestMatch<15,_7,_10>::Store
                      (hasher,(uint8_t *)(ringbuffer_mask_local + i_diff),(int)i_diff + (int)i_end);
            i = i + 2;
          }
        }
      }
    }
    best_len_2._0_4_ = 0;
    do {
      max_distance = max_distance - 1;
      if (max_backward_limit._4_4_ < 5) {
        best_len_code_2 = best_len_code - 1;
        puVar4 = std::min<unsigned_long>(&best_len_code_2,&max_distance);
        local_178 = *puVar4;
      }
      else {
        local_178 = 0;
      }
      local_e0 = local_178;
      best_dist_2 = 0;
      best_score_2 = 0.0;
      local_100 = 4.0;
      cost_diff_lazy = (double)(i_diff + i_end + 1);
      pdVar3 = (double *)
               std::min<unsigned_long>
                         ((unsigned_long *)&cost_diff_lazy,&kMaxBytesForPartialHashInit);
      local_a8 = *pdVar3;
      best_len_2._7_1_ =
           HashLongestMatch<15,_7,_10>::FindLongestMatch
                     (hasher,(uint8_t *)ringbuffer_mask_local,sStack_40,dist_cache,
                      (ulong)((int)i_diff + (int)i_end + 1),max_distance,(size_t)local_a8,&local_e0,
                      &best_dist_2,(size_t *)&best_score_2,&local_100);
      local_110 = 0x401c000000000000;
      if ((!(bool)best_len_2._7_1_) || (local_100 < _delayed_backward_references_in_row + 7.0))
      break;
      i_diff = i_diff + 1;
      i = i + 1;
      best_len_code = local_e0;
      best_dist = best_dist_2;
      best_score = best_score_2;
      _delayed_backward_references_in_row = local_100;
      best_len_2._0_4_ = (int)best_len_2 + 1;
    } while ((int)best_len_2 < 4);
    uStack_90 = i_diff + best_len_code * 2 + apply_random_heuristics;
    distance_code = i_diff + i_end;
    pdVar3 = (double *)std::min<unsigned_long>(&distance_code,&kMaxBytesForPartialHashInit);
    local_a8 = *pdVar3;
    cmd._16_8_ = ComputeDistanceCode((size_t)best_score,(size_t)local_a8,max_backward_limit._4_4_,
                                     dist_cache);
    if (((ulong)best_score <= (ulong)local_a8) && (cmd._16_8_ != 0)) {
      dist_cache[3] = dist_cache[2];
      dist_cache[2] = dist_cache[1];
      dist_cache[1] = *dist_cache;
      *dist_cache = SUB84(best_score,0);
    }
    Command::Command((Command *)&j,i,best_len_code,best_dist,cmd._16_8_);
    commands->insert_len_ = (undefined4)j;
    commands->copy_len_ = j._4_4_;
    commands->cmd_extra_ = cmd._0_8_;
    commands->dist_extra_ = (undefined4)cmd.cmd_extra_;
    commands->cmd_prefix_ = cmd.cmd_extra_._4_2_;
    commands->dist_prefix_ = cmd.cmd_extra_._6_2_;
    *num_literals = i + *num_literals;
    i = 0;
    for (i_jump = 2; i_jump < best_len_code; i_jump = i_jump + 1) {
      HashLongestMatch<15,_7,_10>::Store
                (hasher,(uint8_t *)(ringbuffer_mask_local + i_diff + i_jump),
                 (int)i_diff + (int)i_end + (int)i_jump);
    }
    commands = commands + 1;
    uVar2 = best_len_code + i_diff;
  } while( true );
}

Assistant:

void CreateBackwardReferences(size_t num_bytes,
                              size_t position,
                              bool is_last,
                              const uint8_t* ringbuffer,
                              size_t ringbuffer_mask,
                              const int quality,
                              const int lgwin,
                              Hasher* hasher,
                              int* dist_cache,
                              size_t* last_insert_len,
                              Command* commands,
                              size_t* num_commands,
                              size_t* num_literals) {
  // Set maximum distance, see section 9.1. of the spec.
  const size_t max_backward_limit = (1 << lgwin) - 16;

  // Choose which init method is faster.
  // memset is about 100 times faster than hasher->InitForData().
  const size_t kMaxBytesForPartialHashInit = Hasher::kHashMapSize >> 7;
  if (position == 0 && is_last && num_bytes <= kMaxBytesForPartialHashInit) {
    hasher->InitForData(ringbuffer, num_bytes);
  } else {
    hasher->Init();
  }
  if (num_bytes >= 3 && position >= 3) {
    // Prepare the hashes for three last bytes of the last write.
    // These could not be calculated before, since they require knowledge
    // of both the previous and the current block.
    hasher->Store(&ringbuffer[(position - 3) & ringbuffer_mask],
                  static_cast<uint32_t>(position - 3));
    hasher->Store(&ringbuffer[(position - 2) & ringbuffer_mask],
                  static_cast<uint32_t>(position - 2));
    hasher->Store(&ringbuffer[(position - 1) & ringbuffer_mask],
                  static_cast<uint32_t>(position - 1));
  }
  const Command * const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  size_t i = position & ringbuffer_mask;
  const size_t i_diff = position - i;
  const size_t i_end = i + num_bytes;

  // For speed up heuristics for random data.
  const size_t random_heuristics_window_size = quality < 9 ? 64 : 512;
  size_t apply_random_heuristics = i + random_heuristics_window_size;

  // Minimum score to accept a backward reference.
  const int kMinScore = 4.0;

  while (i + Hasher::kHashTypeLength - 1 < i_end) {
    size_t max_length = i_end - i;
    size_t max_distance = std::min(i + i_diff, max_backward_limit);
    size_t best_len = 0;
    size_t best_len_code = 0;
    size_t best_dist = 0;
    double best_score = kMinScore;
    bool match_found = hasher->FindLongestMatch(
        ringbuffer, ringbuffer_mask,
        dist_cache, static_cast<uint32_t>(i + i_diff), max_length, max_distance,
        &best_len, &best_len_code, &best_dist, &best_score);
    if (match_found) {
      // Found a match. Let's look for something even better ahead.
      int delayed_backward_references_in_row = 0;
      for (;;) {
        --max_length;
        size_t best_len_2 =
            quality < 5 ? std::min(best_len - 1, max_length) : 0;
        size_t best_len_code_2 = 0;
        size_t best_dist_2 = 0;
        double best_score_2 = kMinScore;
        max_distance = std::min(i + i_diff + 1, max_backward_limit);
        match_found = hasher->FindLongestMatch(
            ringbuffer, ringbuffer_mask,
            dist_cache, static_cast<uint32_t>(i + i_diff + 1),
            max_length, max_distance,
            &best_len_2, &best_len_code_2, &best_dist_2, &best_score_2);
        double cost_diff_lazy = 7.0;
        if (match_found && best_score_2 >= best_score + cost_diff_lazy) {
          // Ok, let's just write one byte for now and start a match from the
            // next byte.
          ++i;
          ++insert_length;
          best_len = best_len_2;
          best_len_code = best_len_code_2;
          best_dist = best_dist_2;
          best_score = best_score_2;
          if (++delayed_backward_references_in_row < 4) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          i + 2 * best_len + random_heuristics_window_size;
      max_distance = std::min(i + i_diff, max_backward_limit);
      // The first 16 codes are special shortcodes, and the minimum offset is 1.
      size_t distance_code =
          ComputeDistanceCode(best_dist, max_distance, quality, dist_cache);
      if (best_dist <= max_distance && distance_code > 0) {
        dist_cache[3] = dist_cache[2];
        dist_cache[2] = dist_cache[1];
        dist_cache[1] = dist_cache[0];
        dist_cache[0] = static_cast<int>(best_dist);
      }
      Command cmd(insert_length, best_len, best_len_code, distance_code);
      *commands++ = cmd;
      *num_literals += insert_length;
      insert_length = 0;
      // Put the hash keys into the table, if there are enough
      // bytes left.
      for (size_t j = 2; j < best_len; ++j) {
        hasher->Store(&ringbuffer[i + j],
                      static_cast<uint32_t>(i + i_diff + j));
      }
      i += best_len;
    } else {
      ++insert_length;
      ++i;
      // If we have not seen matches for a long time, we can skip some
      // match lookups. Unsuccessful match lookups are very very expensive
      // and this kind of a heuristic speeds up compression quite
      // a lot.
      if (i > apply_random_heuristics) {
        // Going through uncompressible data, jump.
        if (i > apply_random_heuristics + 4 * random_heuristics_window_size) {
          // It is quite a long time since we saw a copy, so we assume
          // that this data is not compressible, and store hashes less
          // often. Hashes of non compressible data are less likely to
          // turn out to be useful in the future, too, so we store less of
          // them to not to flood out the hash table of good compressible
          // data.
          size_t i_jump = std::min(i + 16, i_end - 4);
          for (; i < i_jump; i += 4) {
            hasher->Store(ringbuffer + i, static_cast<uint32_t>(i + i_diff));
            insert_length += 4;
          }
        } else {
          size_t i_jump = std::min(i + 8, i_end - 3);
          for (; i < i_jump; i += 2) {
            hasher->Store(ringbuffer + i, static_cast<uint32_t>(i + i_diff));
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += i_end - i;
  *last_insert_len = insert_length;
  *num_commands += static_cast<size_t>(commands - orig_commands);
}